

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_parse_block(JSParseState *s)

{
  int iVar1;
  int iVar2;
  
  iVar1 = js_parse_expect(s,0x7b);
  iVar2 = -1;
  if (iVar1 == 0) {
    if ((s->token).val != 0x7d) {
      push_scope(s);
      do {
        iVar2 = js_parse_statement_or_decl(s,7);
        if (iVar2 != 0) {
          return -1;
        }
      } while ((s->token).val != 0x7d);
      pop_scope(s);
    }
    iVar2 = next_token(s);
    iVar2 = -(uint)(iVar2 != 0);
  }
  return iVar2;
}

Assistant:

static __exception int js_parse_block(JSParseState *s)
{
    if (js_parse_expect(s, '{'))
        return -1;
    if (s->token.val != '}') {
        push_scope(s);
        for(;;) {
            if (js_parse_statement_or_decl(s, DECL_MASK_ALL))
                return -1;
            if (s->token.val == '}')
                break;
        }
        pop_scope(s);
    }
    if (next_token(s))
        return -1;
    return 0;
}